

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
::uninitialized_move_n
          (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
          *x,allocator_type *alloc)

{
  long lVar1;
  
  if ((((ulong)x & 7) == 0) && (((ulong)this & 7) == 0)) {
    if (n != 0) {
      lVar1 = 0;
      do {
        *(undefined4 *)(x + lVar1 + j * 4 + 0xc) = *(undefined4 *)(this + lVar1 + i * 4 + 0xc);
        lVar1 = lVar1 + 4;
      } while (n * 4 != lVar1);
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                                  const size_type j, btree_node *x,
                                  allocator_type *alloc) {
            phmap::priv::SanitizerUnpoisonMemoryRegion(
                x->slot(j), n * sizeof(slot_type));
            for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
                 src != end; ++src, ++dest) {
                params_type::construct(alloc, dest, src);
            }
        }